

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

Symbol __thiscall
google::protobuf::DescriptorBuilder::LookupSymbol
          (DescriptorBuilder *this,string *name,string *relative_to,PlaceholderType placeholder_type
          ,ResolveMode resolve_mode,bool build_it)

{
  DescriptorPool *this_00;
  StringPiece name_00;
  Symbol SVar1;
  
  SVar1 = LookupSymbolNoPlaceholder(this,name,relative_to,resolve_mode,build_it);
  if (((SVar1.ptr_ == (SymbolBase *)0x0) || ((SVar1.ptr_)->symbol_type_ == '\0')) &&
     (this_00 = this->pool_, this_00->allow_unknown_ == true)) {
    name_00.ptr_ = (name->_M_dataplus)._M_p;
    name_00.length_ = name->_M_string_length;
    if ((long)name->_M_string_length < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig
                (name->_M_string_length,"string length exceeds max size");
    }
    SVar1 = DescriptorPool::NewPlaceholderWithMutexHeld(this_00,name_00,placeholder_type);
    return (Symbol)SVar1.ptr_;
  }
  return (Symbol)SVar1.ptr_;
}

Assistant:

Symbol DescriptorBuilder::LookupSymbol(
    const std::string& name, const std::string& relative_to,
    DescriptorPool::PlaceholderType placeholder_type, ResolveMode resolve_mode,
    bool build_it) {
  Symbol result =
      LookupSymbolNoPlaceholder(name, relative_to, resolve_mode, build_it);
  if (result.IsNull() && pool_->allow_unknown_) {
    // Not found, but AllowUnknownDependencies() is enabled.  Return a
    // placeholder instead.
    result = pool_->NewPlaceholderWithMutexHeld(name, placeholder_type);
  }
  return result;
}